

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall efsw::String::insert(String *this,size_t pos1,char *s)

{
  String tmp;
  String local_38;
  
  String(&local_38,s);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  insert(&this->mString,pos1,local_38.mString._M_dataplus._M_p);
  std::__cxx11::u32string::~u32string((u32string *)&local_38);
  return this;
}

Assistant:

String& String::insert( size_t pos1, const char* s ) {
	String tmp( s );

	mString.insert( pos1, tmp.data() );

	return *this;
}